

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O1

void fm_matrixToQuat(float *matrix,float *quat)

{
  float fVar1;
  int iVar2;
  QUAT_INDEX QVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  float fVar12;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  float qa [4];
  float local_58 [6];
  long local_40;
  float *local_38;
  ulong uVar11;
  undefined1 auVar13 [16];
  undefined1 extraout_var [60];
  
  fVar12 = *matrix;
  fVar1 = matrix[5];
  fVar4 = fVar12 + fVar1 + matrix[10];
  if (fVar4 <= 0.0) {
    uVar11 = 2;
    if (matrix[10] <= *(float *)((long)matrix + (ulong)((uint)(fVar12 < fVar1) * 0x14))) {
      uVar11 = (ulong)(fVar12 < fVar1);
    }
    uVar10 = (uint)uVar11;
    uVar9 = uVar10 * 4;
    iVar2 = *(int *)((long)dgQuaternion::dgQuaternion::QIndex + (ulong)uVar9);
    lVar7 = (long)iVar2;
    QVar3 = dgQuaternion::dgQuaternion::QIndex[lVar7];
    lVar8 = (long)(int)QVar3;
    local_40 = lVar8 * 4;
    fVar12 = (*(float *)((long)matrix + (ulong)(uVar10 * 0x14)) -
             (matrix[lVar7 * 5] + matrix[lVar8 * 5])) + 1.0;
    if (fVar12 < 0.0) {
      local_38 = quat;
      auVar14._0_4_ = sqrtf(fVar12);
      auVar14._4_60_ = extraout_var;
      auVar13 = auVar14._0_16_;
      quat = local_38;
    }
    else {
      auVar13 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
    }
    fVar12 = auVar13._0_4_;
    local_58[uVar11] = fVar12 * 0.5;
    auVar15._0_12_ = ZEXT812(0);
    auVar15._12_4_ = 0;
    uVar5 = vcmpss_avx512f(auVar13,auVar15,4);
    bVar6 = (bool)((byte)uVar5 & 1);
    fVar12 = (float)((uint)bVar6 * (int)(0.5 / fVar12) + (uint)!bVar6 * (int)fVar12);
    local_58[3] = fVar12 * (matrix[lVar7 * 4 + lVar8] - matrix[local_40 + lVar7]);
    local_58[lVar7] =
         fVar12 * (matrix[(int)(uVar9 + iVar2)] + matrix[(int)((uint)(lVar7 * 4) | uVar10)]);
    local_58[lVar8] =
         fVar12 * (matrix[(int)(QVar3 + uVar9)] + matrix[(int)((uint)local_40 | uVar10)]);
    *quat = local_58[0];
    quat[1] = local_58[1];
    quat[2] = local_58[2];
    quat[3] = local_58[3];
  }
  else {
    fVar4 = fVar4 + 1.0;
    if (fVar4 < 0.0) {
      fVar12 = sqrtf(fVar4);
    }
    else {
      auVar13 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      fVar12 = auVar13._0_4_;
    }
    quat[3] = fVar12 * 0.5;
    fVar12 = 0.5 / fVar12;
    *quat = fVar12 * (matrix[6] - matrix[9]);
    quat[1] = fVar12 * (matrix[8] - matrix[2]);
    quat[2] = fVar12 * (matrix[1] - matrix[4]);
  }
  return;
}

Assistant:

void fm_matrixToQuat(const float *matrix,float *quat) // convert the 3x3 portion of a 4x4 matrix into a quaternion as x,y,z,w
{

	float tr = matrix[0*4+0] + matrix[1*4+1] + matrix[2*4+2];

	// check the diagonal

	if (tr > 0.0f )
	{
		float s = (float) sqrt ( (double) (tr + 1.0f) );
		quat[3] = s * 0.5f;
		s = 0.5f / s;
		quat[0] = (matrix[1*4+2] - matrix[2*4+1]) * s;
		quat[1] = (matrix[2*4+0] - matrix[0*4+2]) * s;
		quat[2] = (matrix[0*4+1] - matrix[1*4+0]) * s;

	}
	else
	{
		// diagonal is negative
		int nxt[3] = {1, 2, 0};
		float  qa[4];

		int i = 0;

		if (matrix[1*4+1] > matrix[0*4+0]) i = 1;
		if (matrix[2*4+2] > matrix[i*4+i]) i = 2;

		int j = nxt[i];
		int k = nxt[j];

		float s = sqrtf ( ((matrix[i*4+i] - (matrix[j*4+j] + matrix[k*4+k])) + 1.0f) );

		qa[i] = s * 0.5f;

		if (s != 0.0f ) s = 0.5f / s;

		qa[3] = (matrix[j*4+k] - matrix[k*4+j]) * s;
		qa[j] = (matrix[i*4+j] + matrix[j*4+i]) * s;
		qa[k] = (matrix[i*4+k] + matrix[k*4+i]) * s;

		quat[0] = qa[0];
		quat[1] = qa[1];
		quat[2] = qa[2];
		quat[3] = qa[3];
	}


}